

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorTables::AddFieldByStylizedNames
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  bool bVar1;
  Descriptor *pDVar2;
  char *local_50;
  undefined1 local_48 [8];
  PointerStringPair camelcase_key;
  undefined1 local_30 [8];
  PointerStringPair lowercase_key;
  void *parent;
  FieldDescriptor *field_local;
  FileDescriptorTables *this_local;
  
  parent = field;
  field_local = (FieldDescriptor *)this;
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    pDVar2 = FieldDescriptor::extension_scope((FieldDescriptor *)parent);
    if (pDVar2 == (Descriptor *)0x0) {
      lowercase_key.second = (char *)FieldDescriptor::file((FieldDescriptor *)parent);
    }
    else {
      lowercase_key.second = (char *)FieldDescriptor::extension_scope((FieldDescriptor *)parent);
    }
  }
  else {
    lowercase_key.second = (char *)FieldDescriptor::containing_type((FieldDescriptor *)parent);
  }
  FieldDescriptor::lowercase_name_abi_cxx11_((FieldDescriptor *)parent);
  camelcase_key.second = (char *)std::__cxx11::string::c_str();
  std::pair<const_void_*,_const_char_*>::pair<const_void_*&,_const_char_*,_true>
            ((pair<const_void_*,_const_char_*> *)local_30,&lowercase_key.second,
             &camelcase_key.second);
  InsertIfNotPresent<google::protobuf::hash_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual>,std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*>
            (&this->fields_by_lowercase_name_,(pair<const_void_*,_const_char_*> *)local_30,
             (FieldDescriptor **)&parent);
  FieldDescriptor::camelcase_name_abi_cxx11_((FieldDescriptor *)parent);
  local_50 = (char *)std::__cxx11::string::c_str();
  std::pair<const_void_*,_const_char_*>::pair<const_void_*&,_const_char_*,_true>
            ((pair<const_void_*,_const_char_*> *)local_48,&lowercase_key.second,&local_50);
  InsertIfNotPresent<google::protobuf::hash_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual>,std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*>
            (&this->fields_by_camelcase_name_,(pair<const_void_*,_const_char_*> *)local_48,
             (FieldDescriptor **)&parent);
  return;
}

Assistant:

void FileDescriptorTables::AddFieldByStylizedNames(
    const FieldDescriptor* field) {
  const void* parent;
  if (field->is_extension()) {
    if (field->extension_scope() == NULL) {
      parent = field->file();
    } else {
      parent = field->extension_scope();
    }
  } else {
    parent = field->containing_type();
  }

  PointerStringPair lowercase_key(parent, field->lowercase_name().c_str());
  InsertIfNotPresent(&fields_by_lowercase_name_, lowercase_key, field);

  PointerStringPair camelcase_key(parent, field->camelcase_name().c_str());
  InsertIfNotPresent(&fields_by_camelcase_name_, camelcase_key, field);
}